

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

bool __thiscall RoboClaw::GetDeadBand(RoboClaw *this,uint8_t *Min,uint8_t *Max)

{
  uint16_t uVar1;
  bool valid;
  bool local_19;
  
  uVar1 = Read2(this,this->m_address,'M',&local_19);
  if (local_19 == true) {
    *Min = (uint8_t)(uVar1 >> 8);
    *Max = (uint8_t)uVar1;
  }
  return local_19;
}

Assistant:

bool RoboClaw::GetDeadBand( uint8_t &Min, uint8_t &Max)
{
    bool valid;
    uint16_t value = Read2( m_address, GETDEADBAND,&valid);
    if(valid)
    {
        Min = value>>8;
        Max = value;
    }
    return valid;
}